

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverIo.c
# Opt level: O1

void Msat_SolverPrintAssignment(Msat_Solver_t *p)

{
  uint uVar1;
  ulong uVar2;
  
  puts("Current assignments are: ");
  if (0 < p->nVars) {
    uVar2 = 0;
    do {
      printf("%d",(ulong)(uint)((int)uVar2 + (int)(uVar2 / 10) * -10));
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while ((int)uVar1 < p->nVars);
  }
  putchar(10);
  if (0 < p->nVars) {
    uVar2 = 0;
    do {
      uVar1 = p->pAssigns[uVar2];
      if (uVar1 == 0xffffffff) {
        uVar1 = 0x2e;
      }
      else {
        if (uVar2 != (uint)((int)uVar1 >> 1)) {
          __assert_fail("i == MSAT_LIT2VAR(p->pAssigns[i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverIo.c"
                        ,0x3b,"void Msat_SolverPrintAssignment(Msat_Solver_t *)");
        }
        uVar1 = uVar1 & 1 ^ 0x31;
      }
      putchar(uVar1);
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)p->nVars);
  }
  putchar(10);
  return;
}

Assistant:

void Msat_SolverPrintAssignment( Msat_Solver_t * p )
{
    int i;
    printf( "Current assignments are: \n" );
    for ( i = 0; i < p->nVars; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );
    for ( i = 0; i < p->nVars; i++ )
        if ( p->pAssigns[i] == MSAT_VAR_UNASSIGNED )
            printf( "." );
        else
        {
            assert( i == MSAT_LIT2VAR(p->pAssigns[i]) );
            if ( MSAT_LITSIGN(p->pAssigns[i]) )
                printf( "0" );
            else 
                printf( "1" );
        }
    printf( "\n" );
}